

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::M3DImporter::convertPose
          (M3DImporter *this,M3DWrapper *m3d,aiMatrix4x4 *m,uint posid,uint orientid)

{
  bool bVar1;
  m3d_t *pmVar2;
  m3dv_t *pmVar3;
  m3dv_t *pmVar4;
  float fVar5;
  m3dv_t *q;
  m3dv_t *p;
  uint orientid_local;
  uint posid_local;
  aiMatrix4x4 *m_local;
  M3DWrapper *m3d_local;
  M3DImporter *this_local;
  
  if (m == (aiMatrix4x4 *)0x0) {
    __assert_fail("m != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x24a,
                  "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
                 );
  }
  bVar1 = M3DWrapper::operator_cast_to_bool(m3d);
  if (bVar1) {
    bVar1 = false;
    if (posid != 0xffffffff) {
      pmVar2 = M3DWrapper::operator->(m3d);
      bVar1 = posid < pmVar2->numvertex;
    }
    if (bVar1) {
      bVar1 = false;
      if (orientid != 0xffffffff) {
        pmVar2 = M3DWrapper::operator->(m3d);
        bVar1 = orientid < pmVar2->numvertex;
      }
      if (bVar1) {
        pmVar2 = M3DWrapper::operator->(m3d);
        pmVar3 = pmVar2->vertex + posid;
        pmVar2 = M3DWrapper::operator->(m3d);
        pmVar4 = pmVar2->vertex + orientid;
        if (((((pmVar4->x != 0.0) || (NAN(pmVar4->x))) || (pmVar4->y != 0.0)) ||
            ((NAN(pmVar4->y) || (pmVar4->z < 0.7071065)))) ||
           ((0.7071075 < pmVar4->z || ((pmVar4->w != 0.0 || (NAN(pmVar4->w))))))) {
          fVar5 = pmVar4->y * pmVar4->y + pmVar4->z * pmVar4->z;
          m->a1 = 1.0 - (fVar5 + fVar5);
          if ((-1e-07 < m->a1) && (m->a1 <= 1e-07 && m->a1 != 1e-07)) {
            m->a1 = 0.0;
          }
          m->a2 = (pmVar4->x * pmVar4->y + -(pmVar4->z * pmVar4->w)) * 2.0;
          if ((-1e-07 < m->a2) && (m->a2 <= 1e-07 && m->a2 != 1e-07)) {
            m->a2 = 0.0;
          }
          m->a3 = (pmVar4->x * pmVar4->z + pmVar4->y * pmVar4->w) * 2.0;
          if ((-1e-07 < m->a3) && (m->a3 <= 1e-07 && m->a3 != 1e-07)) {
            m->a3 = 0.0;
          }
          m->b1 = (pmVar4->x * pmVar4->y + pmVar4->z * pmVar4->w) * 2.0;
          if ((-1e-07 < m->b1) && (m->b1 <= 1e-07 && m->b1 != 1e-07)) {
            m->b1 = 0.0;
          }
          fVar5 = pmVar4->x * pmVar4->x + pmVar4->z * pmVar4->z;
          m->b2 = 1.0 - (fVar5 + fVar5);
          if ((-1e-07 < m->b2) && (m->b2 <= 1e-07 && m->b2 != 1e-07)) {
            m->b2 = 0.0;
          }
          m->b3 = (pmVar4->y * pmVar4->z + -(pmVar4->x * pmVar4->w)) * 2.0;
          if ((-1e-07 < m->b3) && (m->b3 <= 1e-07 && m->b3 != 1e-07)) {
            m->b3 = 0.0;
          }
          m->c1 = (pmVar4->x * pmVar4->z + -(pmVar4->y * pmVar4->w)) * 2.0;
          if ((-1e-07 < m->c1) && (m->c1 <= 1e-07 && m->c1 != 1e-07)) {
            m->c1 = 0.0;
          }
          m->c2 = (pmVar4->y * pmVar4->z + pmVar4->x * pmVar4->w) * 2.0;
          if ((-1e-07 < m->c2) && (m->c2 <= 1e-07 && m->c2 != 1e-07)) {
            m->c2 = 0.0;
          }
          fVar5 = pmVar4->x * pmVar4->x + pmVar4->y * pmVar4->y;
          m->c3 = 1.0 - (fVar5 + fVar5);
          if ((-1e-07 < m->c3) && (m->c3 <= 1e-07 && m->c3 != 1e-07)) {
            m->c3 = 0.0;
          }
        }
        else {
          m->c2 = 0.0;
          m->c1 = 0.0;
          m->b3 = 0.0;
          m->b1 = 0.0;
          m->a3 = 0.0;
          m->a2 = 0.0;
          m->c3 = -1.0;
          m->b2 = -1.0;
          m->a1 = -1.0;
        }
        m->a4 = pmVar3->x;
        m->b4 = pmVar3->y;
        m->c4 = pmVar3->z;
        m->d1 = 0.0;
        m->d2 = 0.0;
        m->d3 = 0.0;
        m->d4 = 1.0;
        return;
      }
      __assert_fail("orientid != 0xffffffff && orientid < m3d->numvertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                    ,0x24d,
                    "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
                   );
    }
    __assert_fail("posid != 0xffffffff && posid < m3d->numvertex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x24c,
                  "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
                 );
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x24b,
                "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
               );
}

Assistant:

void M3DImporter::convertPose(const M3DWrapper &m3d, aiMatrix4x4 *m, unsigned int posid, unsigned int orientid) {
	ai_assert(m != nullptr);
	ai_assert(m3d);
	ai_assert(posid != M3D_UNDEF && posid < m3d->numvertex);
	ai_assert(orientid != M3D_UNDEF && orientid < m3d->numvertex);
	m3dv_t *p = &m3d->vertex[posid];
	m3dv_t *q = &m3d->vertex[orientid];

	/* quaternion to matrix. Do NOT use aiQuaternion to aiMatrix3x3, gives bad results */
	if (q->x == 0.0 && q->y == 0.0 && q->z >= 0.7071065 && q->z <= 0.7071075 && q->w == 0.0) {
		m->a2 = m->a3 = m->b1 = m->b3 = m->c1 = m->c2 = 0.0;
		m->a1 = m->b2 = m->c3 = -1.0;
	} else {
		m->a1 = 1 - 2 * (q->y * q->y + q->z * q->z);
		if (m->a1 > -M3D_EPSILON && m->a1 < M3D_EPSILON) m->a1 = 0.0;
		m->a2 = 2 * (q->x * q->y - q->z * q->w);
		if (m->a2 > -M3D_EPSILON && m->a2 < M3D_EPSILON) m->a2 = 0.0;
		m->a3 = 2 * (q->x * q->z + q->y * q->w);
		if (m->a3 > -M3D_EPSILON && m->a3 < M3D_EPSILON) m->a3 = 0.0;
		m->b1 = 2 * (q->x * q->y + q->z * q->w);
		if (m->b1 > -M3D_EPSILON && m->b1 < M3D_EPSILON) m->b1 = 0.0;
		m->b2 = 1 - 2 * (q->x * q->x + q->z * q->z);
		if (m->b2 > -M3D_EPSILON && m->b2 < M3D_EPSILON) m->b2 = 0.0;
		m->b3 = 2 * (q->y * q->z - q->x * q->w);
		if (m->b3 > -M3D_EPSILON && m->b3 < M3D_EPSILON) m->b3 = 0.0;
		m->c1 = 2 * (q->x * q->z - q->y * q->w);
		if (m->c1 > -M3D_EPSILON && m->c1 < M3D_EPSILON) m->c1 = 0.0;
		m->c2 = 2 * (q->y * q->z + q->x * q->w);
		if (m->c2 > -M3D_EPSILON && m->c2 < M3D_EPSILON) m->c2 = 0.0;
		m->c3 = 1 - 2 * (q->x * q->x + q->y * q->y);
		if (m->c3 > -M3D_EPSILON && m->c3 < M3D_EPSILON) m->c3 = 0.0;
	}

	/* set translation */
	m->a4 = p->x;
	m->b4 = p->y;
	m->c4 = p->z;

	m->d1 = 0;
	m->d2 = 0;
	m->d3 = 0;
	m->d4 = 1;
}